

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8decoder.cpp
# Opt level: O1

uint32_t decode(uint32_t *state,uint32_t *codep,uint8_t byte)

{
  byte bVar1;
  uint uVar2;
  undefined7 in_register_00000011;
  
  bVar1 = ""[CONCAT71(in_register_00000011,byte) & 0xffffffff];
  if (*state == 0) {
    uVar2 = (uint)byte & 0xffU >> (bVar1 & 0x1f);
  }
  else {
    uVar2 = *codep << 6 | (uint)(byte & 0x3f);
  }
  *codep = uVar2;
  bVar1 = ""[(uint)bVar1 + *state * 0x10 + 0x100];
  *state = (uint)bVar1;
  return (uint)bVar1;
}

Assistant:

uint32_t decode(uint32_t *state, uint32_t *codep, uint8_t byte)
{
	uint32_t type = utf8d[byte];

	*codep = (*state != 0) ?
			(byte & 0x3FU) | (*codep << 6) :
			(0xFF >> type) & (byte);

	*state = utf8d[256 + *state * 16 + type];
	return *state;
}